

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O0

void ImGui::SFML::Shutdown(void)

{
  (anonymous_namespace)::s_currWindowCtx = 0;
  SetCurrentContext((ImGuiContext *)0x0);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>
  ::clear((vector<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::WindowContext,_std::default_delete<(anonymous_namespace)::WindowContext>_>_>_>
           *)(anonymous_namespace)::s_windowContexts);
  return;
}

Assistant:

void Shutdown() {
    s_currWindowCtx = nullptr;
    ImGui::SetCurrentContext(nullptr);

    s_windowContexts.clear();
}